

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_11,_7>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  float *pfVar5;
  int col;
  long lVar6;
  int col_1;
  float *pfVar7;
  bool bVar8;
  Vector<float,_2> *pVVar9;
  int ndx;
  float v;
  float fVar10;
  float local_98 [5];
  float local_84;
  Matrix<float,_2,_2> res;
  Vector<float,_2> VStack_68;
  Type in1;
  int aiStack_30 [6];
  
  pfVar1 = in1.m_data.m_data[0].m_data + 3;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    pfVar5 = in1.m_data.m_data[0].m_data + 2;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar6 = 0;
      do {
        fVar10 = 1.0;
        if (lVar4 != lVar6) {
          fVar10 = 0.0;
        }
        pfVar5[lVar6 * 2] = fVar10;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = 1;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
    in1.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in1.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    in1.m_data.m_data[1].m_data[2] = 0.0;
    in1.m_data.m_data[1].m_data[3] = 0.0;
    in1.m_data.m_data[0].m_data[2] = 0.0;
    in1.m_data.m_data[0].m_data[3] = 0.0;
    in1.m_data.m_data[1].m_data[0] = 0.0;
    in1.m_data.m_data[1].m_data[1] = 0.0;
    lVar4 = 0;
    pfVar5 = in1.m_data.m_data[0].m_data + 2;
    bVar2 = true;
    do {
      bVar3 = bVar2;
      lVar6 = 0;
      do {
        pfVar5[lVar6 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar4 + lVar6 * 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = 0x10;
      pfVar5 = pfVar1;
      bVar2 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    res.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    VStack_68.m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in1.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    res.m_data.m_data[1].m_data[0] = -1.2;
    res.m_data.m_data[1].m_data[1] = 0.7;
    VStack_68.m_data[0] = -1.0;
    VStack_68.m_data[1] = -1.0;
    in1.m_data.m_data[0].m_data[0] = 0.7;
    in1.m_data.m_data[0].m_data[1] = -0.3;
  }
  local_98[0] = 1.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 1.0;
  pfVar5 = local_98;
  pfVar7 = in1.m_data.m_data[0].m_data + 2;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar4 = 0;
    pVVar9 = res.m_data.m_data + 1;
    bVar2 = true;
    do {
      bVar8 = bVar2;
      fVar10 = 0.0;
      lVar6 = 0;
      do {
        fVar10 = fVar10 + pfVar7[lVar6 * 2] * pVVar9->m_data[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pfVar5[lVar4 * 2] = fVar10;
      lVar4 = 1;
      pVVar9 = &VStack_68;
      bVar2 = false;
    } while (bVar8);
    pfVar5 = local_98 + 1;
    pfVar7 = pfVar1;
    bVar2 = false;
  } while (bVar3);
  local_84 = local_98[0];
  res.m_data.m_data[0].m_data[0] = local_98[2];
  res.m_data.m_data[0].m_data[1] = local_98[1] + local_98[3];
  aiStack_30[2] = 0;
  aiStack_30[3] = 1;
  aiStack_30[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[aiStack_30[lVar4]] = local_98[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}